

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O2

bool __thiscall OSToken::clearToken(OSToken *this)

{
  Directory *this_00;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  pointer pbVar4;
  allocator local_91;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokenFiles;
  MutexLocker lock;
  string local_68 [32];
  string local_48 [32];
  
  MutexLocker::MutexLocker(&lock,this->tokenMutex);
  (*(this->super_ObjectStoreToken)._vptr_ObjectStoreToken[0xf])(this);
  std::
  _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
  ::clear(&(this->objects)._M_t);
  bVar2 = Directory::refresh(this->tokenDir);
  if (bVar2) {
    Directory::getFiles_abi_cxx11_(&tokenFiles,this->tokenDir);
    for (pbVar4 = tokenFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; this_00 = this->tokenDir,
        pbVar4 != tokenFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
      std::__cxx11::string::string(local_48,(string *)pbVar4);
      iVar3 = Directory::remove(this_00,(char *)local_48);
      std::__cxx11::string::~string(local_48);
      if ((char)iVar3 == '\0') {
        bVar2 = false;
        softHSMLog(3,"clearToken",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                   ,0x1d9,"Failed to remove %s from token directory %s",(pbVar4->_M_dataplus)._M_p,
                   (this->tokenPath)._M_dataplus._M_p);
        goto LAB_0016675d;
      }
    }
    std::__cxx11::string::string(local_68,"",&local_91);
    iVar3 = Directory::rmdir(this_00,(char *)local_68);
    std::__cxx11::string::~string(local_68);
    pcVar1 = (this->tokenPath)._M_dataplus._M_p;
    if ((char)iVar3 == '\0') {
      bVar2 = false;
      softHSMLog(3,"clearToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x1e2,"Failed to remove the token directory %s",pcVar1);
    }
    else {
      bVar2 = true;
      softHSMLog(7,"clearToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x1e7,"Token instance %s was succesfully cleared",pcVar1);
    }
LAB_0016675d:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tokenFiles);
  }
  else {
    bVar2 = false;
  }
  MutexLocker::~MutexLocker(&lock);
  return bVar2;
}

Assistant:

bool OSToken::clearToken()
{
	MutexLocker lock(tokenMutex);

	// Invalidate the token
	invalidate();

	// First, clear out all objects
	objects.clear();

	// Now, delete all files in the token directory
	if (!tokenDir->refresh())
	{
		return false;
	}

	std::vector<std::string> tokenFiles = tokenDir->getFiles();

	for (std::vector<std::string>::iterator i = tokenFiles.begin(); i != tokenFiles.end(); i++)
	{
		if (!tokenDir->remove(*i))
		{
			ERROR_MSG("Failed to remove %s from token directory %s", i->c_str(), tokenPath.c_str());

			return false;
		}
	}

	// Now remove the token directory
	if (!tokenDir->rmdir(""))
	{
		ERROR_MSG("Failed to remove the token directory %s", tokenPath.c_str());

		return false;
	}

	DEBUG_MSG("Token instance %s was succesfully cleared", tokenPath.c_str());

	return true;
}